

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O3

basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
jsoncons::jsonpointer::detail::
resolve<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *current,
          string_view_type *buffer,error_code *ec)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar4;
  uint uVar5;
  jsonpointer_errc __e;
  type tVar6;
  size_t index;
  ulong local_20;
  
  pbVar4 = current;
  while( true ) {
    uVar5 = (byte)(pbVar4->field_0).json_ref_ & 0xf;
    if (1 < uVar5 - 8) break;
    pbVar4 = *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)
              ((long)&pbVar4->field_0 + 8);
  }
  if (uVar5 == 0xe) {
    if (((char *)buffer->_M_len == (char *)0x1) && (*(detail *)buffer->_M_str == (detail)0x2d)) {
      __e = index_exceeds_array_size;
    }
    else {
      local_20 = 0;
      tVar6 = jsoncons::detail::dec_to_integer<unsigned_long,char>
                        ((detail *)buffer->_M_str,(char *)buffer->_M_len,(size_t)&local_20,
                         (unsigned_long *)(ulong)uVar5);
      uVar1 = local_20;
      __e = invalid_index;
      if (tVar6.ec == success) {
        sVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                          (current);
        __e = index_exceeds_array_size;
        if (uVar1 < sVar3) {
          pbVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                             (current,local_20);
          return pbVar4;
        }
      }
    }
  }
  else {
    bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_object
                      (current);
    if (bVar2) {
      bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::contains
                        (current,buffer);
      if (bVar2) {
        pbVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                           (current,buffer);
        return pbVar4;
      }
      __e = key_not_found;
    }
    else {
      __e = expected_object_or_array;
    }
  }
  std::error_code::operator=(ec,__e);
  return current;
}

Assistant:

const Json* resolve(const Json* current, const typename Json::string_view_type& buffer, std::error_code& ec)
    {
        if (current->is_array())
        {
            if (buffer.size() == 1 && buffer[0] == '-')
            {
                ec = jsonpointer_errc::index_exceeds_array_size;
                return current;
            }
            std::size_t index{0};
            auto result = jsoncons::detail::dec_to_integer(buffer.data(), buffer.length(), index);
            if (!result)
            {
                ec = jsonpointer_errc::invalid_index;
                return current;
            }
            if (index >= current->size())
            {
                ec = jsonpointer_errc::index_exceeds_array_size;
                return current;
            }
            current = std::addressof(current->at(index));
        }
        else if (current->is_object())
        {
            if (!current->contains(buffer))
            {
                ec = jsonpointer_errc::key_not_found;
                return current;
            }
            current = std::addressof(current->at(buffer));
        }
        else
        {
            ec = jsonpointer_errc::expected_object_or_array;
            return current;
        }
        return current;
    }